

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

int Matvec_SparseCSC(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  realtype *prVar9;
  realtype *__s;
  long lVar10;
  long lVar11;
  int iVar12;
  
  pvVar1 = A->content;
  lVar2 = *(long *)((long)pvVar1 + 0x38);
  lVar3 = *(long *)((long)pvVar1 + 0x20);
  lVar4 = *(long *)((long)pvVar1 + 0x30);
  iVar12 = 1;
  if (lVar3 != 0 && (lVar4 != 0 && lVar2 != 0)) {
    prVar9 = N_VGetArrayPointer(x);
    __s = N_VGetArrayPointer(y);
    if (prVar9 != __s && (__s != (realtype *)0x0 && prVar9 != (realtype *)0x0)) {
      plVar5 = (long *)A->content;
      lVar6 = *plVar5;
      if (0 < lVar6) {
        memset(__s,0,lVar6 << 3);
      }
      lVar6 = plVar5[1];
      if (0 < lVar6) {
        lVar10 = 0;
        do {
          lVar11 = *(long *)(lVar2 + lVar10 * 8);
          lVar7 = *(long *)(lVar2 + 8 + lVar10 * 8);
          if (lVar11 < lVar7) {
            do {
              lVar8 = *(long *)(lVar4 + lVar11 * 8);
              __s[lVar8] = *(double *)(lVar3 + lVar11 * 8) * prVar9[lVar10] + __s[lVar8];
              lVar11 = lVar11 + 1;
            } while (lVar7 != lVar11);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar6);
      }
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

int Matvec_SparseCSC(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Ai;
  realtype *Ax, *xd, *yd;

  /* access data from CSC structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Ai = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Ai == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd) )
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix columns */
  for (j=0; j<SM_COLUMNS_S(A); j++) {

    /* iterate down column of A, performing product */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      yd[Ai[i]] += Ax[i]*xd[j];

  }

  return 0;
}